

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O1

Expression *
soul::ExpressionHelpers::create
          (Expression *__return_storage_ptr__,Expression *e,StringDictionary *dictionary)

{
  long *plVar1;
  long lVar2;
  QualifiedIdentifier *q;
  char *__s;
  Expression *this;
  Expression result;
  _Any_data local_358;
  code *local_348;
  code *pcStack_340;
  Expression local_338;
  Expression local_318;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  Expression local_180;
  Expression local_168;
  Expression local_150;
  Expression local_138;
  Expression local_120;
  Expression local_108;
  Expression local_f0;
  Expression local_d8;
  Expression local_c0;
  Expression local_a8;
  Expression local_90;
  Expression local_78;
  string local_60;
  pool_ptr<soul::AST::Expression> local_40;
  pool_ptr<soul::AST::Expression> local_38;
  
  lVar2 = __dynamic_cast(e,&AST::Expression::typeinfo,&AST::SubscriptWithBrackets::typeinfo,0);
  if (lVar2 != 0) {
    create(&local_a8,*(Expression **)(lVar2 + 0x30),dictionary);
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"[","");
    createText((Expression *)&local_358,&local_220);
    operator+(&local_90,&local_a8,(Expression *)&local_358);
    local_38.object = *(Expression **)(lVar2 + 0x38);
    createIfNotNull(&local_338,&local_38,dictionary);
    operator+(&local_78,&local_90,&local_338);
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"]","");
    createText(&local_318,&local_240);
    operator+(__return_storage_ptr__,&local_78,&local_318);
    std::
    vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
    ::~vector(&local_318.sections);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
    ::~vector(&local_78.sections);
    std::
    vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
    ::~vector(&local_338.sections);
    std::
    vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
    ::~vector(&local_90.sections);
    std::
    vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
    ::~vector((vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
               *)&local_358);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
    ::~vector(&local_a8.sections);
    if (lVar2 != 0) {
      return __return_storage_ptr__;
    }
  }
  lVar2 = __dynamic_cast(e,&AST::Expression::typeinfo,&AST::SubscriptWithChevrons::typeinfo,0);
  if (lVar2 != 0) {
    create(&local_f0,*(Expression **)(lVar2 + 0x30),dictionary);
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"<","");
    createText((Expression *)&local_358,&local_260);
    operator+(&local_d8,&local_f0,(Expression *)&local_358);
    local_40.object = *(Expression **)(lVar2 + 0x38);
    createIfNotNull(&local_338,&local_40,dictionary);
    operator+(&local_c0,&local_d8,&local_338);
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,">","");
    createText(&local_318,&local_280);
    operator+(__return_storage_ptr__,&local_c0,&local_318);
    std::
    vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
    ::~vector(&local_318.sections);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
    ::~vector(&local_c0.sections);
    std::
    vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
    ::~vector(&local_338.sections);
    std::
    vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
    ::~vector(&local_d8.sections);
    std::
    vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
    ::~vector((vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
               *)&local_358);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
    ::~vector(&local_f0.sections);
    if (lVar2 != 0) {
      return __return_storage_ptr__;
    }
  }
  lVar2 = __dynamic_cast(e,&AST::Expression::typeinfo,&AST::DotOperator::typeinfo,0);
  if (lVar2 != 0) {
    create(&local_120,*(Expression **)(lVar2 + 0x30),dictionary);
    local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,".","");
    createText((Expression *)&local_358,&local_2a0);
    operator+(&local_108,&local_120,(Expression *)&local_358);
    plVar1 = *(long **)(*(long *)(lVar2 + 0x38) + 0x30);
    if (plVar1 == (long *)0x0) {
      throwInternalCompilerError("isValid()","toString",0x23);
    }
    local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_2c0,*plVar1,plVar1[1] + *plVar1);
    createText(&local_338,&local_2c0);
    operator+(__return_storage_ptr__,&local_108,&local_338);
    std::
    vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
    ::~vector(&local_338.sections);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
    ::~vector(&local_108.sections);
    std::
    vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
    ::~vector((vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
               *)&local_358);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
    ::~vector(&local_120.sections);
    if (lVar2 != 0) {
      return __return_storage_ptr__;
    }
  }
  q = (QualifiedIdentifier *)
      __dynamic_cast(e,&AST::Expression::typeinfo,&AST::QualifiedIdentifier::typeinfo,0);
  if (q == (QualifiedIdentifier *)0x0) {
    lVar2 = __dynamic_cast(e,&AST::Expression::typeinfo,&AST::Constant::typeinfo,0);
    if (lVar2 != 0) {
      soul::Value::getDescription_abi_cxx11_(&local_60,(Value *)(lVar2 + 0x30),dictionary);
      createText(__return_storage_ptr__,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      if (lVar2 != 0) {
        return __return_storage_ptr__;
      }
    }
    lVar2 = __dynamic_cast(e,&AST::Expression::typeinfo,&AST::TypeMetaFunction::typeinfo,0);
    if (lVar2 != 0) {
      if (*(int *)(lVar2 + 0x38) == 2) {
        local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"const ","");
        createKeyword(&local_150,&local_1a0);
        create((Expression *)&local_358,*(Expression **)(lVar2 + 0x30),dictionary);
        operator+(__return_storage_ptr__,&local_150,(Expression *)&local_358);
        std::
        vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
        ::~vector((vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                   *)&local_358);
        std::
        vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
        ::~vector(&local_150.sections);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
          operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        if (*(int *)(lVar2 + 0x38) == 3) {
          create(&local_138,*(Expression **)(lVar2 + 0x30),dictionary);
          local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"&","");
          createText((Expression *)&local_358,&local_2e0);
          operator+(__return_storage_ptr__,&local_138,(Expression *)&local_358);
          std::
          vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
          ::~vector((vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                     *)&local_358);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
            operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
          }
          this = &local_138;
        }
        else {
          create(&local_180,*(Expression **)(lVar2 + 0x30),dictionary);
          local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,".","");
          createText((Expression *)&local_358,&local_300);
          operator+(&local_168,&local_180,(Expression *)&local_358);
          __s = AST::TypeMetaFunction::getNameForOperation(*(Op *)(lVar2 + 0x38));
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1c0,__s,(allocator<char> *)&local_318);
          createText(&local_338,&local_1c0);
          operator+(__return_storage_ptr__,&local_168,&local_338);
          std::
          vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
          ::~vector(&local_338.sections);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
            operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
          }
          std::
          vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
          ::~vector(&local_168.sections);
          std::
          vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
          ::~vector((vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                     *)&local_358);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_300._M_dataplus._M_p != &local_300.field_2) {
            operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
          }
          this = &local_180;
        }
        std::
        vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
        ::~vector(&this->sections);
      }
      if (lVar2 != 0) {
        return __return_storage_ptr__;
      }
    }
    local_358._M_unused._M_object = &local_338;
    local_338.sections.
    super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_338.sections.
    super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_338.sections.
    super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pcStack_340 = std::
                  _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/documentation/soul_SourceCodeModel.cpp:149:27)>
                  ::_M_invoke;
    local_348 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/documentation/soul_SourceCodeModel.cpp:149:27)>
                ::_M_manager;
    local_358._8_8_ = e;
    catchParseErrors((function<void_()> *)&local_358);
    if (local_348 != (code *)0x0) {
      (*local_348)(&local_358,&local_358,3);
    }
    if (local_338.sections.
        super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_338.sections.
        super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      SourceCodeUtilities::findRangeOfASTObject((CodeLocationRange *)&local_358,(ASTObject *)e);
      CodeLocationRange::toString_abi_cxx11_(&local_200,(CodeLocationRange *)&local_358);
      choc::text::trim(&local_1e0,&local_200);
      createText(__return_storage_ptr__,&local_1e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
      }
      CodeLocationRange::~CodeLocationRange((CodeLocationRange *)&local_358);
    }
    else {
      (__return_storage_ptr__->sections).
      super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_338.sections.
           super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (__return_storage_ptr__->sections).
      super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_338.sections.
           super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->sections).
      super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_338.sections.
           super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_338.sections.
      super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_338.sections.
      super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_338.sections.
      super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    std::
    vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
    ::~vector(&local_338.sections);
  }
  else {
    fromIdentifier(__return_storage_ptr__,q);
  }
  return __return_storage_ptr__;
}

Assistant:

static SourceCodeModel::Expression create (AST::Expression& e, const StringDictionary& dictionary)
    {
        if (auto s = cast<AST::SubscriptWithBrackets> (e))  return create (s->lhs, dictionary) + createText ("[") + createIfNotNull (s->rhs, dictionary) + createText ("]");
        if (auto s = cast<AST::SubscriptWithChevrons> (e))  return create (s->lhs, dictionary) + createText ("<") + createIfNotNull (s->rhs, dictionary) + createText (">");
        if (auto d = cast<AST::DotOperator> (e))            return create (d->lhs, dictionary) + createText (".") + createText (d->rhs.identifier.toString());
        if (auto q = cast<AST::QualifiedIdentifier> (e))    return fromIdentifier (*q);
        if (auto c = cast<AST::Constant> (e))               return createText (c->value.getDescription (std::addressof (dictionary)));

        if (auto m = cast<AST::TypeMetaFunction> (e))
        {
            if (m->operation == AST::TypeMetaFunction::Op::makeReference)
                return create (m->source, dictionary) + createText ("&");

            if (m->operation == AST::TypeMetaFunction::Op::makeConst)
                return createKeyword ("const ") + create (m->source, dictionary);

            return create (m->source, dictionary) + createText (".") + createText (AST::TypeMetaFunction::getNameForOperation (m->operation));
        }

        SourceCodeModel::Expression result;
        catchParseErrors ([&] { result = create (e.resolveAsType()); });

        if (! result.sections.empty())
            return result;

        return createText (choc::text::trim (SourceCodeUtilities::findRangeOfASTObject (e).toString()));
    }